

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLDSAPublicKey.cpp
# Opt level: O2

void __thiscall OSSLDSAPublicKey::createOSSLKey(OSSLDSAPublicKey *this)

{
  DSA *dsa;
  DSA_METHOD *pDVar1;
  BIGNUM *pBVar2;
  BIGNUM *pBVar3;
  BIGNUM *pBVar4;
  BIGNUM *pBVar5;
  
  if (this->dsa != (DSA *)0x0) {
    return;
  }
  dsa = DSA_new();
  this->dsa = (DSA *)dsa;
  if (dsa != (DSA *)0x0) {
    pDVar1 = DSA_OpenSSL();
    DSA_set_method(dsa,pDVar1);
    pBVar2 = OSSL::byteString2bn(&(this->super_DSAPublicKey).p);
    pBVar3 = OSSL::byteString2bn(&(this->super_DSAPublicKey).q);
    pBVar4 = OSSL::byteString2bn(&(this->super_DSAPublicKey).g);
    pBVar5 = OSSL::byteString2bn(&(this->super_DSAPublicKey).y);
    DSA_set0_pqg(this->dsa,pBVar2,pBVar3,pBVar4);
    DSA_set0_key(this->dsa,pBVar5,0);
    return;
  }
  softHSMLog(3,"createOSSLKey",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLDSAPublicKey.cpp"
             ,0xa6,"Could not create DSA object");
  return;
}

Assistant:

void OSSLDSAPublicKey::createOSSLKey()
{
	if (dsa != NULL) return;

	dsa = DSA_new();
	if (dsa == NULL)
	{
		ERROR_MSG("Could not create DSA object");
		return;
	}

	// Use the OpenSSL implementation and not any engine
#if OPENSSL_VERSION_NUMBER < 0x10100000L || defined(LIBRESSL_VERSION_NUMBER)

#ifdef WITH_FIPS
	if (FIPS_mode())
		DSA_set_method(dsa, FIPS_dsa_openssl());
	else
		DSA_set_method(dsa, DSA_OpenSSL());
#else
	DSA_set_method(dsa, DSA_OpenSSL());
#endif

#else
	DSA_set_method(dsa, DSA_OpenSSL());
#endif

	BIGNUM* bn_p = OSSL::byteString2bn(p);
	BIGNUM* bn_q = OSSL::byteString2bn(q);
	BIGNUM* bn_g = OSSL::byteString2bn(g);
	BIGNUM* bn_pub_key = OSSL::byteString2bn(y);

	DSA_set0_pqg(dsa, bn_p, bn_q, bn_g);
	DSA_set0_key(dsa, bn_pub_key, NULL);
}